

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_text_redo(ImGuiInputTextState *str,STB_TexteditState *state)

{
  undefined4 pos;
  undefined4 n;
  undefined4 new_text_len;
  undefined4 uVar1;
  ImWchar IVar2;
  StbUndoRecord *pSVar3;
  StbUndoRecord *pSVar4;
  int local_3c;
  int iStack_38;
  int i;
  StbUndoRecord r;
  StbUndoRecord *u;
  StbUndoState *s;
  STB_TexteditState *state_local;
  ImGuiInputTextState *str_local;
  
  if ((state->undostate).redo_point != 99) {
    pSVar3 = (state->undostate).undo_rec + (state->undostate).undo_point;
    pSVar4 = (state->undostate).undo_rec + (state->undostate).redo_point;
    pos = pSVar4->where;
    new_text_len = pSVar4->insert_length;
    n = pSVar4->delete_length;
    uVar1 = pSVar4->char_storage;
    pSVar3->delete_length = new_text_len;
    pSVar3->insert_length = n;
    pSVar3->where = pos;
    pSVar3->char_storage = -1;
    if (n != 0) {
      if ((state->undostate).redo_char_point <
          (state->undostate).undo_char_point + pSVar3->insert_length) {
        pSVar3->insert_length = 0;
        pSVar3->delete_length = 0;
      }
      else {
        pSVar3->char_storage = (state->undostate).undo_char_point;
        (state->undostate).undo_char_point =
             (state->undostate).undo_char_point + pSVar3->insert_length;
        for (local_3c = 0; local_3c < pSVar3->insert_length; local_3c = local_3c + 1) {
          IVar2 = STB_TEXTEDIT_GETCHAR(str,pSVar3->where + local_3c);
          (state->undostate).undo_char[pSVar3->char_storage + local_3c] = IVar2;
        }
      }
      STB_TEXTEDIT_DELETECHARS(str,pos,n);
    }
    if (new_text_len != 0) {
      STB_TEXTEDIT_INSERTCHARS(str,pos,(state->undostate).undo_char + (int)uVar1,new_text_len);
      (state->undostate).redo_char_point = new_text_len + (state->undostate).redo_char_point;
    }
    state->cursor = pos + new_text_len;
    (state->undostate).undo_point = (state->undostate).undo_point + 1;
    (state->undostate).redo_point = (state->undostate).redo_point + 1;
  }
  return;
}

Assistant:

static void stb_text_redo(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   StbUndoState *s = &state->undostate;
   StbUndoRecord *u, r;
   if (s->redo_point == STB_TEXTEDIT_UNDOSTATECOUNT)
      return;

   // we need to do two things: apply the redo record, and create an undo record
   u = &s->undo_rec[s->undo_point];
   r = s->undo_rec[s->redo_point];

   // we KNOW there must be room for the undo record, because the redo record
   // was derived from an undo record

   u->delete_length = r.insert_length;
   u->insert_length = r.delete_length;
   u->where = r.where;
   u->char_storage = -1;

   if (r.delete_length) {
      // the redo record requires us to delete characters, so the undo record
      // needs to store the characters

      if (s->undo_char_point + u->insert_length > s->redo_char_point) {
         u->insert_length = 0;
         u->delete_length = 0;
      } else {
         int i;
         u->char_storage = s->undo_char_point;
         s->undo_char_point = s->undo_char_point + u->insert_length;

         // now save the characters
         for (i=0; i < u->insert_length; ++i)
            s->undo_char[u->char_storage + i] = STB_TEXTEDIT_GETCHAR(str, u->where + i);
      }

      STB_TEXTEDIT_DELETECHARS(str, r.where, r.delete_length);
   }

   if (r.insert_length) {
      // easy case: need to insert n characters
      STB_TEXTEDIT_INSERTCHARS(str, r.where, &s->undo_char[r.char_storage], r.insert_length);
      s->redo_char_point += r.insert_length;
   }

   state->cursor = r.where + r.insert_length;

   s->undo_point++;
   s->redo_point++;
}